

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time_zone_info.cc
# Opt level: O2

civil_second
absl::lts_20250127::time_internal::cctz::anon_unknown_0::YearShift(civil_second *cs,year_t shift)

{
  fields fVar1;
  civil_second cVar2;
  
  fVar1 = detail::impl::n_sec(shift + (cs->f_).y,(long)(cs->f_).m,(long)(cs->f_).d,(long)(cs->f_).hh
                              ,(long)(cs->f_).mm,(long)(cs->f_).ss);
  cVar2.f_.y = fVar1.y;
  cVar2.f_._8_8_ = fVar1._8_8_ & 0xffffffffff;
  return (civil_second)cVar2.f_;
}

Assistant:

inline civil_second YearShift(const civil_second& cs, year_t shift) {
  return civil_second(cs.year() + shift, cs.month(), cs.day(), cs.hour(),
                      cs.minute(), cs.second());
}